

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O0

bool __thiscall AmsConnection::ReceiveNotification(AmsConnection *this,AoEHeader *header)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  element_type *peVar4;
  ulong uVar5;
  size_t sVar6;
  ostream *poVar7;
  void *this_00;
  ulong local_3d0;
  size_t chunk;
  size_t i;
  stringstream local_3a0 [8];
  stringstream stream_1;
  ostream local_390 [380];
  uint local_214;
  RingBuffer *pRStack_210;
  uint32_t bytesLeft;
  RingBuffer *ring;
  string local_200 [32];
  stringstream local_1e0 [8];
  stringstream stream;
  ostream local_1d0 [396];
  AmsAddr local_44;
  uint16_t local_3c;
  pair<unsigned_short,_AmsAddr> local_3a;
  undefined1 local_30 [8];
  SharedDispatcher dispatcher;
  AoEHeader *header_local;
  AmsConnection *this_local;
  
  dispatcher.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)header;
  local_3c = AoEHeader::targetPort(header);
  local_44 = AoEHeader::sourceAms
                       ((AoEHeader *)
                        dispatcher.
                        super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
  std::pair<unsigned_short,_AmsAddr>::pair<unsigned_short,_AmsAddr,_true>
            (&local_3a,&local_3c,&local_44);
  DispatcherListGet((AmsConnection *)local_30,(VirtualConnection *)this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    pRStack_210 = &peVar4->ring;
    local_214 = AoEHeader::length((AoEHeader *)
                                  dispatcher.
                                  super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi);
    uVar5 = (ulong)local_214;
    sVar6 = RingBuffer::BytesFree(pRStack_210);
    if (sVar6 < uVar5 + 4) {
      ReceiveJunk(this,(ulong)local_214);
      std::__cxx11::stringstream::stringstream(local_3a0);
      poVar7 = std::operator<<(local_390,"port ");
      this_00 = (void *)std::ostream::operator<<(poVar7,std::dec);
      uVar2 = AoEHeader::targetPort
                        ((AoEHeader *)
                         dispatcher.
                         super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
      poVar7 = (ostream *)std::ostream::operator<<(this_00,uVar2);
      std::operator<<(poVar7," receive buffer was full");
      std::__cxx11::stringstream::str();
      Logger::Log(2,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::stringstream::~stringstream(local_3a0);
      this_local._7_1_ = false;
    }
    else {
      for (chunk = 0; chunk < 4; chunk = chunk + 1) {
        *pRStack_210->write = (uint8_t)(local_214 >> (((byte)chunk & 3) << 3));
        RingBuffer::Write(pRStack_210,1);
      }
      local_3d0 = RingBuffer::WriteChunk(pRStack_210);
      while (local_3d0 < local_214) {
        Receive(this,pRStack_210->write,local_3d0,(timeval *)0x0);
        RingBuffer::Write(pRStack_210,local_3d0);
        local_214 = local_214 - (int)local_3d0;
        local_3d0 = RingBuffer::WriteChunk(pRStack_210);
      }
      Receive(this,pRStack_210->write,(ulong)local_214,(timeval *)0x0);
      RingBuffer::Write(pRStack_210,(ulong)local_214);
      peVar4 = std::
               __shared_ptr_access<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      NotificationDispatcher::Notify(peVar4);
      this_local._7_1_ = true;
    }
  }
  else {
    uVar3 = AoEHeader::length((AoEHeader *)
                              dispatcher.
                              super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
    ReceiveJunk(this,(ulong)uVar3);
    std::__cxx11::stringstream::stringstream(local_1e0);
    std::operator<<(local_1d0,"No dispatcher found for notification");
    std::__cxx11::stringstream::str();
    Logger::Log(2,local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::stringstream::~stringstream(local_1e0);
    this_local._7_1_ = false;
  }
  ring._4_4_ = 1;
  std::shared_ptr<NotificationDispatcher>::~shared_ptr
            ((shared_ptr<NotificationDispatcher> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool AmsConnection::ReceiveNotification(const AoEHeader& header)
{
    const auto dispatcher = DispatcherListGet(VirtualConnection { header.targetPort(), header.sourceAms() });
    if (!dispatcher) {
        ReceiveJunk(header.length());
        LOG_WARN("No dispatcher found for notification");
        return false;
    }

    auto& ring = dispatcher->ring;
    auto bytesLeft = header.length();
    if (bytesLeft + sizeof(bytesLeft) > ring.BytesFree()) {
        ReceiveJunk(bytesLeft);
        LOG_WARN("port " << std::dec << header.targetPort() << " receive buffer was full");
        return false;
    }

    /** store AoEHeader.length() in ring buffer to support notification parsing */
    for (size_t i = 0; i < sizeof(bytesLeft); ++i) {
        *ring.write = (bytesLeft >> (8 * i)) & 0xFF;
        ring.Write(1);
    }

    auto chunk = ring.WriteChunk();
    while (bytesLeft > chunk) {
        Receive(ring.write, chunk);
        ring.Write(chunk);
        // We already checked bytesLeft > chunk, well it was not obvious enough for MSVC
        bytesLeft -= static_cast<decltype(bytesLeft)>(chunk);
        chunk = ring.WriteChunk();
    }
    Receive(ring.write, bytesLeft);
    ring.Write(bytesLeft);
    dispatcher->Notify();
    return true;
}